

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayCopy
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayCopy *curr,
          optional<wasm::HeapType> dest,optional<wasm::HeapType> src)

{
  _Storage<wasm::HeapType,_true> heapType;
  _Storage<wasm::HeapType,_true> _Var1;
  Type local_48;
  Type local_40;
  _Storage<wasm::HeapType,_true> local_38;
  
  heapType = dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  _Var1 = src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload;
  if (((undefined1  [16])
       dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    heapType._M_value = wasm::Type::getHeapType(&curr->destRef->type);
  }
  if (((undefined1  [16])
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    _Var1._M_value = wasm::Type::getHeapType(&curr->srcRef->type);
  }
  local_38 = _Var1;
  wasm::Type::Type(&local_48,heapType._M_value,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->destRef,local_48);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->destIndex,(Type)0x2);
  wasm::Type::Type(&local_40,local_38._M_value.id,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->srcRef,local_40);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->srcIndex,(Type)0x2);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->length,(Type)0x2);
  return;
}

Assistant:

void visitArrayCopy(ArrayCopy* curr,
                      std::optional<HeapType> dest = std::nullopt,
                      std::optional<HeapType> src = std::nullopt) {
    if (!dest) {
      dest = curr->destRef->type.getHeapType();
    }
    if (!src) {
      src = curr->srcRef->type.getHeapType();
    }
    note(&curr->destRef, Type(*dest, Nullable));
    note(&curr->destIndex, Type::i32);
    note(&curr->srcRef, Type(*src, Nullable));
    note(&curr->srcIndex, Type::i32);
    note(&curr->length, Type::i32);
  }